

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_serialize_container
          (t_cpp_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  t_cpp_generator *this_00;
  string *iter_00;
  string iter;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeSetBegin(";
      poVar2 = std::operator<<(poVar2,"xfer += oprot->writeSetBegin(");
      type_to_enum_abi_cxx11_
                (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_130);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,"static_cast<uint32_t>(");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,".size()));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_00189dc9;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeListBegin(";
      poVar2 = std::operator<<(poVar2,"xfer += oprot->writeListBegin(");
      type_to_enum_abi_cxx11_
                (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_130);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,"static_cast<uint32_t>(");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,".size()));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_00189dc9;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "xfer += oprot->writeMapBegin(";
    poVar2 = std::operator<<(poVar2,"xfer += oprot->writeMapBegin(");
    type_to_enum_abi_cxx11_
              (&local_130,(t_cpp_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    this_00 = (t_cpp_generator *)0x2fdaef;
    poVar2 = std::operator<<(poVar2,", ");
    type_to_enum_abi_cxx11_(&local_110,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar2 = std::operator<<(poVar2,(string *)&local_110);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"static_cast<uint32_t>(");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".size()));");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
LAB_00189dc9:
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::string((string *)&local_b0,"_iter",(allocator *)&local_110);
  t_generator::tmp(&local_130,(t_generator *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_110);
  type_name_abi_cxx11_(&local_d0,this,ttype,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,"::const_iterator ");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2,";");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_f0);
  poVar2 = std::operator<<(poVar2,"for (");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".begin(); ");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2," != ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".end(); ++");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2,")");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      iter_00 = &local_70;
      std::__cxx11::string::string((string *)iter_00,(string *)&local_130);
      generate_serialize_set_element(this,out,(t_set *)ttype,iter_00);
      goto LAB_0018a013;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      iter_00 = &local_90;
      std::__cxx11::string::string((string *)iter_00,(string *)&local_130);
      generate_serialize_list_element(this,out,(t_list *)ttype,iter_00);
      goto LAB_0018a013;
    }
  }
  else {
    iter_00 = &local_50;
    std::__cxx11::string::string((string *)iter_00,(string *)&local_130);
    generate_serialize_map_element(this,out,(t_map *)ttype,iter_00);
LAB_0018a013:
    std::__cxx11::string::~string((string *)iter_00);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_0018a0a1;
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeListEnd();";
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += oprot->writeSetEnd();";
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "xfer += oprot->writeMapEnd();";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
LAB_0018a0a1:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "static_cast<uint32_t>(" << prefix << ".size()));" << endl;
  }

  string iter = tmp("_iter");
  out << indent() << type_name(ttype) << "::const_iterator " << iter << ";" << endl << indent()
      << "for (" << iter << " = " << prefix << ".begin(); " << iter << " != " << prefix
      << ".end(); ++" << iter << ")" << endl;
  scope_up(out);
  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }
  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "xfer += oprot->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += oprot->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += oprot->writeListEnd();" << endl;
  }

  scope_down(out);
}